

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cappuccino::
lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::find(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *__return_storage_ptr__,
      lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,peek peek)

{
  int iVar1;
  undefined8 uVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    do_find(__return_storage_ptr__,this,key,peek);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar2);
}

Assistant:

auto find(const key_type& key, peek peek = peek::no) -> std::optional<value_type>
    {
        std::lock_guard guard{m_lock};
        return do_find(key, peek);
    }